

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::remove
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,char *__filename)

{
  bool bVar1;
  char *in_RDX;
  char *length;
  char *pcVar2;
  
  length = (char *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  if (__filename < length && in_RDX != (char *)0x0) {
    if (__filename == (char *)0x0) {
      pcVar2 = length + -(long)in_RDX;
      if (length < in_RDX || pcVar2 == (char *)0x0) {
        clear(this);
        length = (char *)0x0;
      }
      else {
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
             in_RDX + (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p
        ;
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length =
             (size_t)pcVar2;
        length = pcVar2;
      }
    }
    else if (in_RDX == (char *)0xffffffffffffffff || length <= in_RDX + (long)__filename) {
      bVar1 = overrideLength(this,(size_t)__filename);
      length = (char *)0xffffffffffffffff;
      if (bVar1) {
        length = __filename;
      }
    }
    else {
      bVar1 = ensureExclusive(this);
      if (bVar1) {
        length = length + -(long)in_RDX;
        __wrap_memcpy(__filename +
                      (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p
                      ,in_RDX + (long)(__filename +
                                      (long)(this->
                                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
                                            ).m_p),(long)length - (long)__filename);
        bVar1 = overrideLength(this,(size_t)length);
        if (!bVar1) {
          length = (char *)0xffffffffffffffff;
        }
      }
      else {
        length = (char *)0xffffffffffffffff;
      }
    }
  }
  return (int)length;
}

Assistant:

size_t
	remove(
		size_t index,
		size_t count = 1
	) {
		bool result;

		if (count == 0)
			return this->m_length;

		size_t oldLength = this->m_length;
		if (index >= oldLength)
			return oldLength;
		else if (index == 0)
			if (count >= oldLength) {
				clear();
				return 0;
			} else {
				this->m_p += count;
				this->m_length -= count;
				return this->m_length;
			}

		if (count == -1 || index + count >= oldLength) {
			result = overrideLength(index);
			return result ? index : -1;
		}

		result = ensureExclusive();
		if (!result)
			return -1;

		size_t newLength = oldLength - count;

		T* dst = this->m_p + index;
		Details::copy(dst, dst + count, newLength - index);

		result = overrideLength(newLength);
		return result ? newLength : -1;
	}